

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageOperands
          (ValidationState_t *_,Instruction *inst,ImageTypeInfo *info,uint32_t word_index)

{
  ushort uVar1;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  Op OVar12;
  int32_t iVar13;
  spv_result_t sVar14;
  Instruction *pIVar15;
  DiagnosticStream *pDVar16;
  ulong uVar17;
  long lVar18;
  Instruction *unaff_RBX;
  char *pcVar19;
  string *val;
  uint uVar20;
  spv_result_t unaff_R12D;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint64_t array_size;
  Op local_250;
  string local_238;
  undefined1 local_218 [16];
  DiagnosticStream local_208;
  
  uVar22 = (ulong)word_index;
  if ((anonymous_namespace)::
      ValidateImageOperands(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,spvtools::val::(anonymous_namespace)::ImageTypeInfo_const&,unsigned_int)
      ::kAllImageOperandsHandled == '\0') {
    _GLOBAL__N_1::ValidateImageOperands();
    unaff_RBX = inst;
  }
  puVar2 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar23 = (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
  uVar17 = (ulong)(word_index - 1);
  uVar20 = 0;
  if (uVar17 < uVar23) {
    uVar20 = puVar2[uVar17];
  }
  uVar1 = (inst->inst_).opcode;
  if (uVar17 < uVar23) {
    uVar17 = 0;
    uVar8 = uVar20 & 0xffff83ff;
    if (uVar8 != 0) {
      do {
        uVar21 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar21;
        uVar8 = uVar8 - 1 & uVar8;
      } while (uVar8 != 0);
      uVar17 = (ulong)uVar21;
    }
    unaff_R12D = (spv_result_t)unaff_RBX;
    if (uVar17 + ((uVar20 >> 2 & 1) != 0) != uVar23 - uVar22) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,
                 "Number of image operand ids doesn\'t correspond to the bit mask",0x3e);
      DiagnosticStream::~DiagnosticStream(&local_208);
      return local_208.error_;
    }
LAB_0064c328:
    if ((info->multisampled & ((uVar20 & 0x40) >> 6 ^ 1)) == 0) {
      if (uVar20 == 0) {
        return SPV_SUCCESS;
      }
      uVar8 = uVar20 & 0x10038;
      if (uVar8 != 0) {
        uVar21 = 0;
        do {
          uVar21 = uVar21 + 1;
          uVar8 = uVar8 - 1 & uVar8;
        } while (uVar8 != 0);
        if (1 < uVar21) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = 
          "Image Operands Offset, ConstOffset, ConstOffsets, Offsets cannot be used together";
          lVar18 = 0x51;
          goto LAB_0064c388;
        }
      }
      OVar12 = (Op)uVar1;
      bVar3 = IsImplicitLod(OVar12);
      bVar4 = IsExplicitLod(OVar12);
      if ((OVar12 - OpImageRead < 2) || (bVar5 = bVar4, OVar12 == OpImageSparseRead)) {
        bVar5 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityImageReadWriteLodAMD);
      }
      if ((OVar12 == OpImageSparseGather) || (OVar12 == OpImageGather)) {
        bVar6 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityImageGatherBiasLodAMD);
      }
      else {
        bVar6 = false;
      }
      if ((uVar20 & 1) == 0) {
LAB_0064c493:
        local_250 = (Op)uVar1;
        if ((uVar20 & 2) != 0) {
          if ((((bVar5 == false) && (local_250 != OpImageFetch)) &&
              (local_250 != OpImageSparseFetch)) && (bVar6 == false)) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       "Image Operand Lod can only be used with ExplicitLod opcodes ",0x3c);
            pcVar19 = "and OpImageFetch";
            lVar18 = 0x10;
            goto LAB_0064c388;
          }
          if ((uVar20 & 4) != 0) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar19 = "Image Operand bits Lod and Grad cannot be set at the same time";
            goto LAB_0064c383;
          }
          uVar9 = ValidationState_t::GetTypeId
                            (_,(inst->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar22]);
          if ((bVar6 | bVar4) == 1) {
            bVar5 = ValidationState_t::IsFloatScalarType(_,uVar9);
            if (bVar5) goto LAB_0064c9aa;
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       "Expected Image Operand Lod to be float scalar when used ",0x38);
            pcVar19 = "with ExplicitLod";
            lVar18 = 0x10;
LAB_0064ccc2:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar19,lVar18)
            ;
            unaff_R12D = local_208.error_;
            DiagnosticStream::~DiagnosticStream(&local_208);
            bVar5 = false;
          }
          else {
            bVar5 = ValidationState_t::IsIntScalarType(_,uVar9);
            if (!bVar5) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Expected Image Operand Lod to be int scalar when used with ",0x3b);
              pcVar19 = "OpImageFetch";
              lVar18 = 0xc;
              goto LAB_0064ccc2;
            }
LAB_0064c9aa:
            bVar5 = true;
            if (Cube < info->dim) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Image Operand Lod requires \'Dim\' parameter to be 1D, 2D, 3D or Cube",
                         0x43);
              unaff_R12D = local_208.error_;
              DiagnosticStream::~DiagnosticStream(&local_208);
              bVar5 = false;
            }
          }
          if (!bVar5) {
            return unaff_R12D;
          }
          uVar22 = (ulong)((int)uVar22 + 1);
        }
        if ((uVar20 & 4) != 0) {
          if (!bVar4) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar19 = "Image Operand Grad can only be used with ExplicitLod opcodes";
            goto LAB_0064c7c4;
          }
          uVar9 = ValidationState_t::GetTypeId
                            (_,(inst->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar22]);
          uVar10 = ValidationState_t::GetTypeId
                             (_,(inst->words_).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[(int)uVar22 + 1]);
          bVar4 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar9);
          if ((bVar4) && (bVar4 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar10), bVar4)) {
            uVar11 = GetPlaneCoordSize(info);
            uVar9 = ValidationState_t::GetDimension(_,uVar9);
            uVar10 = ValidationState_t::GetDimension(_,uVar10);
            if (uVar11 != uVar9) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Expected Image Operand Grad dx to have ",0x27);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208," components, but given ",0x17);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              goto LAB_0064c81a;
            }
            bVar4 = true;
            if (uVar11 != uVar10) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Expected Image Operand Grad dy to have ",0x27);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208," components, but given ",0x17);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              unaff_R12D = local_208.error_;
              DiagnosticStream::~DiagnosticStream(&local_208);
              bVar4 = false;
            }
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       "Expected both Image Operand Grad ids to be float scalars or ",0x3c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"vectors",7);
LAB_0064c81a:
            unaff_R12D = local_208.error_;
            DiagnosticStream::~DiagnosticStream(&local_208);
            bVar4 = false;
          }
          if (!bVar4) {
            return unaff_R12D;
          }
          uVar22 = (ulong)((int)uVar22 + 2);
        }
        if ((uVar20 & 8) != 0) {
          if (info->dim == Cube) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar19 = "Image Operand ConstOffset cannot be used with Cube Image \'Dim\'";
            goto LAB_0064c383;
          }
          uVar9 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar22];
          uVar10 = ValidationState_t::GetTypeId(_,uVar9);
          bVar4 = ValidationState_t::IsIntScalarOrVectorType(_,uVar10);
          if (bVar4) {
            OVar12 = ValidationState_t::GetIdOpcode(_,uVar9);
            iVar13 = spvOpcodeIsConstant(OVar12);
            if (iVar13 == 0) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar19 = "Expected Image Operand ConstOffset to be a const object";
              lVar18 = 0x37;
              goto LAB_0064d033;
            }
            uVar9 = GetPlaneCoordSize(info);
            uVar10 = ValidationState_t::GetDimension(_,uVar10);
            bVar4 = uVar9 == uVar10;
            if (!bVar4) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Expected Image Operand ConstOffset to have ",0x2b);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208," components, but given ",0x17);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              unaff_R12D = local_208.error_;
              DiagnosticStream::~DiagnosticStream(&local_208);
            }
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       "Expected Image Operand ConstOffset to be int scalar or ",0x37);
            pcVar19 = "vector";
            lVar18 = 6;
LAB_0064d033:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar19,lVar18)
            ;
            unaff_R12D = local_208.error_;
            DiagnosticStream::~DiagnosticStream(&local_208);
            bVar4 = false;
          }
          if (!bVar4) {
            return unaff_R12D;
          }
          uVar22 = (ulong)((int)uVar22 + 1);
        }
        if ((uVar20 & 0x10) != 0) {
          if (info->dim == Cube) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar19 = "Image Operand Offset cannot be used with Cube Image \'Dim\'";
            lVar18 = 0x39;
            goto LAB_0064c388;
          }
          uVar9 = ValidationState_t::GetTypeId
                            (_,(inst->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar22]);
          bVar4 = ValidationState_t::IsIntScalarOrVectorType(_,uVar9);
          if (bVar4) {
            uVar10 = GetPlaneCoordSize(info);
            uVar9 = ValidationState_t::GetDimension(_,uVar9);
            if (uVar10 != uVar9) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Expected Image Operand Offset to have ",0x26);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208," components, but given ",0x17);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              goto LAB_0064d122;
            }
            bVar4 = true;
            if (((_->options_->before_hlsl_legalization == false) &&
                (bVar5 = spvIsVulkanEnv(_->context_->target_env), bVar5)) &&
               ((_->options_->allow_offset_texture_operand == false &&
                ((1 < uVar1 - 0x60 && (1 < uVar1 - 0x13a)))))) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              ValidationState_t::VkErrorID_abi_cxx11_(&local_238,_,0x27e5,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Image Operand Offset can only be used with OpImage*Gather operations",0x44
                        );
              unaff_R12D = local_208.error_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              DiagnosticStream::~DiagnosticStream(&local_208);
              goto LAB_0064d12a;
            }
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"Expected Image Operand Offset to be int scalar or ",
                       0x32);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"vector",6);
LAB_0064d122:
            unaff_R12D = local_208.error_;
            DiagnosticStream::~DiagnosticStream(&local_208);
LAB_0064d12a:
            bVar4 = false;
          }
          if (!bVar4) {
            return unaff_R12D;
          }
          uVar22 = (ulong)((int)uVar22 + 1);
        }
        if ((uVar20 & 0x20) == 0) {
LAB_0064c85f:
          if ((uVar20 & 0x40) == 0) {
LAB_0064c91b:
            if ((char)uVar20 < '\0') {
              if ((char)((uVar20 & 4) >> 2) == '\0' && !bVar3) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,
                           "Image Operand MinLod can only be used with ImplicitLod ",0x37);
                pcVar19 = "opcodes or together with Image Operand Grad";
                lVar18 = 0x2b;
                goto LAB_0064c388;
              }
              uVar9 = ValidationState_t::GetTypeId
                                (_,(inst->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar22]);
              bVar3 = ValidationState_t::IsFloatScalarType(_,uVar9);
              if (bVar3) {
                if (Cube < info->dim) {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar19 = 
                  "Image Operand MinLod requires \'Dim\' parameter to be 1D, 2D, 3D or Cube";
                  lVar18 = 0x46;
                  goto LAB_0064d3a9;
                }
                if (info->multisampled == 0) {
                  bVar3 = true;
                  local_208.error_ = unaff_R12D;
                }
                else {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,
                             "Image Operand MinLod requires \'MS\' parameter to be 0",0x34);
                  DiagnosticStream::~DiagnosticStream(&local_208);
                  bVar3 = false;
                }
              }
              else {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                pcVar19 = "Expected Image Operand MinLod to be float scalar";
                lVar18 = 0x30;
LAB_0064d3a9:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,pcVar19,lVar18);
                DiagnosticStream::~DiagnosticStream(&local_208);
                bVar3 = false;
              }
              if (!bVar3) {
                return local_208.error_;
              }
              uVar22 = (ulong)((int)uVar22 + 1);
            }
            if ((uVar20 >> 8 & 1) == 0) {
LAB_0064c92f:
              if ((uVar20 >> 9 & 1) == 0) {
                return SPV_SUCCESS;
              }
              if ((local_250 != OpImageRead) && (local_250 != OpImageSparseRead)) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,
                           "Image Operand MakeTexelVisibleKHR can only be used with Op",0x3a);
                local_238._M_dataplus._M_p = spvOpcodeString(OpImageRead);
                pDVar16 = DiagnosticStream::operator<<(&local_208,(char **)&local_238);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar16," or Op",6);
                local_218._0_8_ = spvOpcodeString(OpImageSparseRead);
                pDVar16 = DiagnosticStream::operator<<(pDVar16,(char **)local_218);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar16,": Op",4);
                pcVar19 = spvOpcodeString(local_250);
                val = (string *)(local_218 + 8);
                goto LAB_0064d49f;
              }
              if ((uVar20 >> 10 & 1) != 0) {
                sVar14 = ValidateMemoryScope(_,inst,(inst->words_).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar22])
                ;
                if (sVar14 == SPV_SUCCESS) {
                  return SPV_SUCCESS;
                }
                return sVar14;
              }
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Image Operand MakeTexelVisibleKHR requires NonPrivateTexelKHR is also specified: Op"
                         ,0x53);
LAB_0064d222:
              pDVar16 = &local_208;
              local_238._M_dataplus._M_p = spvOpcodeString(local_250);
              val = &local_238;
            }
            else {
              if (local_250 == OpImageWrite) {
                if ((uVar20 >> 10 & 1) != 0) {
                  sVar14 = ValidateMemoryScope(_,inst,(inst->words_).
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar22])
                  ;
                  if (sVar14 != SPV_SUCCESS) {
                    return sVar14;
                  }
                  uVar22 = (ulong)((int)uVar22 + 1);
                  goto LAB_0064c92f;
                }
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,
                           "Image Operand MakeTexelAvailableKHR requires NonPrivateTexelKHR is also specified: Op"
                           ,0x55);
                local_250 = OpImageWrite;
                goto LAB_0064d222;
              }
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Image Operand MakeTexelAvailableKHR can only be used with Op",0x3c);
              local_238._M_dataplus._M_p = spvOpcodeString(OpImageWrite);
              pDVar16 = DiagnosticStream::operator<<(&local_208,(char **)&local_238);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar16,": Op",4);
              pcVar19 = spvOpcodeString(local_250);
              val = (string *)local_218;
LAB_0064d49f:
              (val->_M_dataplus)._M_p = pcVar19;
            }
            pDVar16 = DiagnosticStream::operator<<(pDVar16,(char **)val);
            local_208.error_ = pDVar16->error_;
            goto LAB_0064c397;
          }
          if ((((local_250 - OpImageFetch < 5) &&
               ((0x19U >> (local_250 - OpImageFetch & 0x1f) & 1) != 0)) ||
              (local_250 == OpImageSparseFetch)) || (local_250 == OpImageSparseRead)) {
            if (info->multisampled != 0) {
              uVar9 = ValidationState_t::GetTypeId
                                (_,(inst->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar22]);
              bVar4 = ValidationState_t::IsIntScalarType(_,uVar9);
              if (!bVar4) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Expected Image Operand Sample to be int scalar",
                           0x2e);
                DiagnosticStream::~DiagnosticStream(&local_208);
                return local_208.error_;
              }
              uVar22 = (ulong)((int)uVar22 + 1);
              goto LAB_0064c91b;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar19 = "Image Operand Sample requires non-zero \'MS\' parameter";
            lVar18 = 0x35;
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       "Image Operand Sample can only be used with OpImageFetch, ",0x39);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"OpImageRead, OpImageWrite, OpImageSparseFetch and ",
                       0x32);
            pcVar19 = "OpImageSparseRead";
            lVar18 = 0x11;
          }
        }
        else if ((local_250 - OpImageGather < 2) || (local_250 - OpImageSparseGather < 2)) {
          if (info->dim != Cube) {
            uVar9 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar22];
            uVar10 = ValidationState_t::GetTypeId(_,uVar9);
            pIVar15 = ValidationState_t::FindDef(_,uVar10);
            if (pIVar15 == (Instruction *)0x0) {
              __assert_fail("type_inst",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                            ,0x1eb,
                            "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageOperands(ValidationState_t &, const Instruction *, const ImageTypeInfo &, uint32_t)"
                           );
            }
            if ((pIVar15->inst_).opcode == 0x1c) {
              local_238._M_dataplus._M_p = (char *)0x0;
              bVar4 = ValidationState_t::EvalConstantValUint64
                                (_,(pIVar15->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[3],
                                 (uint64_t *)&local_238);
              if (!bVar4) {
                __assert_fail("0 && \"Array type definition is corrupt\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                              ,500,
                              "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageOperands(ValidationState_t &, const Instruction *, const ImageTypeInfo &, uint32_t)"
                             );
              }
              if (local_238._M_dataplus._M_p != (char *)0x4) goto LAB_0064cf40;
              uVar10 = (pIVar15->words_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[2];
              bVar4 = ValidationState_t::IsIntVectorType(_,uVar10);
              if ((!bVar4) || (uVar10 = ValidationState_t::GetDimension(_,uVar10), uVar10 != 2)) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                pcVar19 = 
                "Expected Image Operand ConstOffsets array components to be int vectors of size 2";
                lVar18 = 0x50;
                goto LAB_0064cf66;
              }
              OVar12 = ValidationState_t::GetIdOpcode(_,uVar9);
              iVar13 = spvOpcodeIsConstant(OVar12);
              bVar4 = true;
              if (iVar13 == 0) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                pcVar19 = "Expected Image Operand ConstOffsets to be a const object";
                lVar18 = 0x38;
                goto LAB_0064cf66;
              }
            }
            else {
LAB_0064cf40:
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar19 = "Expected Image Operand ConstOffsets to be an array of size 4";
              lVar18 = 0x3c;
LAB_0064cf66:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,pcVar19,lVar18);
              unaff_R12D = local_208.error_;
              DiagnosticStream::~DiagnosticStream(&local_208);
              bVar4 = false;
            }
            if (!bVar4) {
              return unaff_R12D;
            }
            uVar22 = (ulong)((int)uVar22 + 1);
            goto LAB_0064c85f;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Image Operand ConstOffsets cannot be used with Cube Image \'Dim\'";
          lVar18 = 0x3f;
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = 
          "Image Operand ConstOffsets can only be used with OpImageGather and OpImageDrefGather";
          lVar18 = 0x54;
        }
      }
      else {
        if (bVar3 || bVar6 != false) {
          uVar9 = ValidationState_t::GetTypeId
                            (_,(inst->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar22]);
          bVar7 = ValidationState_t::IsFloatScalarType(_,uVar9);
          if (bVar7) {
            bVar7 = true;
            if (Cube < info->dim) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Image Operand Bias requires \'Dim\' parameter to be 1D, 2D, 3D or Cube",
                         0x44);
              unaff_R12D = local_208.error_;
              DiagnosticStream::~DiagnosticStream(&local_208);
              bVar7 = false;
            }
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"Expected Image Operand Bias to be float scalar",0x2e);
            unaff_R12D = local_208.error_;
            DiagnosticStream::~DiagnosticStream(&local_208);
            bVar7 = false;
          }
          if (!bVar7) {
            return unaff_R12D;
          }
          uVar22 = (ulong)(word_index + 1);
          goto LAB_0064c493;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = "Image Operand Bias can only be used with ImplicitLod opcodes";
LAB_0064c7c4:
        lVar18 = 0x3c;
      }
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Image Operand Sample is required for operation on multi-sampled image";
      lVar18 = 0x45;
    }
  }
  else {
    if (uVar23 == uVar17) goto LAB_0064c328;
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar19 = "Number of image operand ids doesn\'t correspond to the bit mask";
LAB_0064c383:
    lVar18 = 0x3e;
  }
LAB_0064c388:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar19,lVar18);
LAB_0064c397:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t ValidateImageOperands(ValidationState_t& _,
                                   const Instruction* inst,
                                   const ImageTypeInfo& info,
                                   uint32_t word_index) {
  static const bool kAllImageOperandsHandled = CheckAllImageOperandsHandled();
  (void)kAllImageOperandsHandled;

  const spv::Op opcode = inst->opcode();
  const size_t num_words = inst->words().size();

  const bool have_explicit_mask = (word_index - 1 < num_words);
  const uint32_t mask = have_explicit_mask ? inst->word(word_index - 1) : 0u;

  if (have_explicit_mask) {
    // NonPrivate, Volatile, SignExtend, ZeroExtend take no operand words.
    const uint32_t mask_bits_having_operands =
        mask & ~uint32_t(spv::ImageOperandsMask::NonPrivateTexelKHR |
                         spv::ImageOperandsMask::VolatileTexelKHR |
                         spv::ImageOperandsMask::SignExtend |
                         spv::ImageOperandsMask::ZeroExtend |
                         spv::ImageOperandsMask::Nontemporal);
    size_t expected_num_image_operand_words =
        spvtools::utils::CountSetBits(mask_bits_having_operands);
    if (mask & uint32_t(spv::ImageOperandsMask::Grad)) {
      // Grad uses two words.
      ++expected_num_image_operand_words;
    }

    if (expected_num_image_operand_words != num_words - word_index) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Number of image operand ids doesn't correspond to the bit "
                "mask";
    }
  } else if (num_words != word_index - 1) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Number of image operand ids doesn't correspond to the bit mask";
  }

  if (info.multisampled &
      (0 == (mask & uint32_t(spv::ImageOperandsMask::Sample)))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Image Operand Sample is required for operation on "
              "multi-sampled image";
  }

  // After this point, only set bits in the image operands mask can cause
  // the module to be invalid.
  if (mask == 0) return SPV_SUCCESS;

  if (spvtools::utils::CountSetBits(
          mask & uint32_t(spv::ImageOperandsMask::Offset |
                          spv::ImageOperandsMask::ConstOffset |
                          spv::ImageOperandsMask::ConstOffsets |
                          spv::ImageOperandsMask::Offsets)) > 1) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Image Operands Offset, ConstOffset, ConstOffsets, Offsets "
              "cannot be used together";
  }

  const bool is_implicit_lod = IsImplicitLod(opcode);
  const bool is_explicit_lod = IsExplicitLod(opcode);
  const bool is_valid_lod_operand = IsValidLodOperand(_, opcode);
  const bool is_valid_gather_lod_bias_amd = IsValidGatherLodBiasAMD(_, opcode);

  // The checks should be done in the order of definition of OperandImage.

  if (mask & uint32_t(spv::ImageOperandsMask::Bias)) {
    if (!is_implicit_lod && !is_valid_gather_lod_bias_amd) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Bias can only be used with ImplicitLod opcodes";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsFloatScalarType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Bias to be float scalar";
    }

    if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
        info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Bias requires 'Dim' parameter to be 1D, 2D, 3D "
                "or Cube";
    }

    // Multisampled is already checked.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Lod)) {
    if (!is_valid_lod_operand && opcode != spv::Op::OpImageFetch &&
        opcode != spv::Op::OpImageSparseFetch &&
        !is_valid_gather_lod_bias_amd) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Lod can only be used with ExplicitLod opcodes "
             << "and OpImageFetch";
    }

    if (mask & uint32_t(spv::ImageOperandsMask::Grad)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand bits Lod and Grad cannot be set at the same "
                "time";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (is_explicit_lod || is_valid_gather_lod_bias_amd) {
      if (!_.IsFloatScalarType(type_id)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Image Operand Lod to be float scalar when used "
               << "with ExplicitLod";
      }
    } else {
      if (!_.IsIntScalarType(type_id)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Image Operand Lod to be int scalar when used with "
               << "OpImageFetch";
      }
    }

    if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
        info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Lod requires 'Dim' parameter to be 1D, 2D, 3D "
                "or Cube";
    }

    // Multisampled is already checked.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Grad)) {
    if (!is_explicit_lod) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Grad can only be used with ExplicitLod opcodes";
    }

    const uint32_t dx_type_id = _.GetTypeId(inst->word(word_index++));
    const uint32_t dy_type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsFloatScalarOrVectorType(dx_type_id) ||
        !_.IsFloatScalarOrVectorType(dy_type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected both Image Operand Grad ids to be float scalars or "
             << "vectors";
    }

    const uint32_t plane_size = GetPlaneCoordSize(info);
    const uint32_t dx_size = _.GetDimension(dx_type_id);
    const uint32_t dy_size = _.GetDimension(dy_type_id);
    if (plane_size != dx_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Grad dx to have " << plane_size
             << " components, but given " << dx_size;
    }

    if (plane_size != dy_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Grad dy to have " << plane_size
             << " components, but given " << dy_size;
    }

    // Multisampled is already checked.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::ConstOffset)) {
    if (info.dim == spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand ConstOffset cannot be used with Cube Image "
                "'Dim'";
    }

    const uint32_t id = inst->word(word_index++);
    const uint32_t type_id = _.GetTypeId(id);
    if (!_.IsIntScalarOrVectorType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffset to be int scalar or "
             << "vector";
    }

    if (!spvOpcodeIsConstant(_.GetIdOpcode(id))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffset to be a const object";
    }

    const uint32_t plane_size = GetPlaneCoordSize(info);
    const uint32_t offset_size = _.GetDimension(type_id);
    if (plane_size != offset_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffset to have " << plane_size
             << " components, but given " << offset_size;
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Offset)) {
    if (info.dim == spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Offset cannot be used with Cube Image 'Dim'";
    }

    const uint32_t id = inst->word(word_index++);
    const uint32_t type_id = _.GetTypeId(id);
    if (!_.IsIntScalarOrVectorType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Offset to be int scalar or "
             << "vector";
    }

    const uint32_t plane_size = GetPlaneCoordSize(info);
    const uint32_t offset_size = _.GetDimension(type_id);
    if (plane_size != offset_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Offset to have " << plane_size
             << " components, but given " << offset_size;
    }

    if (!_.options()->before_hlsl_legalization &&
        spvIsVulkanEnv(_.context()->target_env) &&
        !_.options()->allow_offset_texture_operand) {
      if (opcode != spv::Op::OpImageGather &&
          opcode != spv::Op::OpImageDrefGather &&
          opcode != spv::Op::OpImageSparseGather &&
          opcode != spv::Op::OpImageSparseDrefGather) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << _.VkErrorID(10213)
               << "Image Operand Offset can only be used with "
                  "OpImage*Gather operations";
      }
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::ConstOffsets)) {
    if (opcode != spv::Op::OpImageGather &&
        opcode != spv::Op::OpImageDrefGather &&
        opcode != spv::Op::OpImageSparseGather &&
        opcode != spv::Op::OpImageSparseDrefGather) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand ConstOffsets can only be used with "
                "OpImageGather and OpImageDrefGather";
    }

    if (info.dim == spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand ConstOffsets cannot be used with Cube Image "
                "'Dim'";
    }

    const uint32_t id = inst->word(word_index++);
    const uint32_t type_id = _.GetTypeId(id);
    const Instruction* type_inst = _.FindDef(type_id);
    assert(type_inst);

    if (type_inst->opcode() != spv::Op::OpTypeArray) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets to be an array of size 4";
    }

    uint64_t array_size = 0;
    if (!_.EvalConstantValUint64(type_inst->word(3), &array_size)) {
      assert(0 && "Array type definition is corrupt");
    }

    if (array_size != 4) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets to be an array of size 4";
    }

    const uint32_t component_type = type_inst->word(2);
    if (!_.IsIntVectorType(component_type) ||
        _.GetDimension(component_type) != 2) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets array components to be "
                "int vectors of size 2";
    }

    if (!spvOpcodeIsConstant(_.GetIdOpcode(id))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets to be a const object";
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Sample)) {
    if (opcode != spv::Op::OpImageFetch && opcode != spv::Op::OpImageRead &&
        opcode != spv::Op::OpImageWrite &&
        opcode != spv::Op::OpImageSparseFetch &&
        opcode != spv::Op::OpImageSparseRead) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Sample can only be used with OpImageFetch, "
             << "OpImageRead, OpImageWrite, OpImageSparseFetch and "
             << "OpImageSparseRead";
    }

    if (info.multisampled == 0) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Sample requires non-zero 'MS' parameter";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsIntScalarType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Sample to be int scalar";
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::MinLod)) {
    if (!is_implicit_lod && !(mask & uint32_t(spv::ImageOperandsMask::Grad))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MinLod can only be used with ImplicitLod "
             << "opcodes or together with Image Operand Grad";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsFloatScalarType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand MinLod to be float scalar";
    }

    if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
        info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MinLod requires 'Dim' parameter to be 1D, 2D, "
                "3D or Cube";
    }

    if (info.multisampled != 0) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MinLod requires 'MS' parameter to be 0";
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::MakeTexelAvailableKHR)) {
    // Checked elsewhere: capability and memory model are correct.
    if (opcode != spv::Op::OpImageWrite) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelAvailableKHR can only be used with Op"
             << spvOpcodeString(spv::Op::OpImageWrite) << ": Op"
             << spvOpcodeString(opcode);
    }

    if (!(mask & uint32_t(spv::ImageOperandsMask::NonPrivateTexelKHR))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelAvailableKHR requires "
                "NonPrivateTexelKHR is also specified: Op"
             << spvOpcodeString(opcode);
    }

    const auto available_scope = inst->word(word_index++);
    if (auto error = ValidateMemoryScope(_, inst, available_scope))
      return error;
  }

  if (mask & uint32_t(spv::ImageOperandsMask::MakeTexelVisibleKHR)) {
    // Checked elsewhere: capability and memory model are correct.
    if (opcode != spv::Op::OpImageRead &&
        opcode != spv::Op::OpImageSparseRead) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelVisibleKHR can only be used with Op"
             << spvOpcodeString(spv::Op::OpImageRead) << " or Op"
             << spvOpcodeString(spv::Op::OpImageSparseRead) << ": Op"
             << spvOpcodeString(opcode);
    }

    if (!(mask & uint32_t(spv::ImageOperandsMask::NonPrivateTexelKHR))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelVisibleKHR requires NonPrivateTexelKHR "
                "is also specified: Op"
             << spvOpcodeString(opcode);
    }

    const auto visible_scope = inst->word(word_index++);
    if (auto error = ValidateMemoryScope(_, inst, visible_scope)) return error;
  }

  if (mask & uint32_t(spv::ImageOperandsMask::SignExtend)) {
    // Checked elsewhere: SPIR-V 1.4 version or later.

    // "The texel value is converted to the target value via sign extension.
    // Only valid when the texel type is a scalar or vector of integer type."
    //
    // We don't have enough information to know what the texel type is.
    // In OpenCL, knowledge is deferred until runtime: the image SampledType is
    // void, and the Format is Unknown.
    // In Vulkan, the texel type is only known in all cases by the pipeline
    // setup.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::ZeroExtend)) {
    // Checked elsewhere: SPIR-V 1.4 version or later.

    // "The texel value is converted to the target value via zero extension.
    // Only valid when the texel type is a scalar or vector of integer type."
    //
    // We don't have enough information to know what the texel type is.
    // In OpenCL, knowledge is deferred until runtime: the image SampledType is
    // void, and the Format is Unknown.
    // In Vulkan, the texel type is only known in all cases by the pipeline
    // setup.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Offsets)) {
    // TODO: add validation
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Nontemporal)) {
    // Checked elsewhere: SPIR-V 1.6 version or later.
  }

  return SPV_SUCCESS;
}